

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_fxmul(sexp ctx,sexp d,sexp a,sexp_uint_t b,int offset)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong in_RCX;
  long in_RDX;
  sexp in_RSI;
  long in_RDI;
  int in_R8D;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp_luint_t n;
  sexp_uint_t i;
  sexp_uint_t carry;
  sexp_uint_t *adata;
  sexp_uint_t *data;
  sexp_uint_t len;
  undefined1 *local_80;
  sexp_uint_t len_00;
  sexp ctx_00;
  undefined1 in_stack_ffffffffffffff98 [16];
  ulong local_50;
  ulong local_48;
  sexp local_10;
  
  uVar1 = *(ulong *)(in_RDX + 0x10);
  local_48 = 0;
  ctx_00 = (sexp)&DAT_0000043e;
  memset(&local_80,0,0x10);
  local_80 = &stack0xffffffffffffff90;
  len_00 = *(sexp_uint_t *)(in_RDI + 0x6080);
  *(undefined1 ***)(in_RDI + 0x6080) = &local_80;
  if ((in_RSI == (sexp)0x0) ||
     (local_10 = in_RSI, (in_RSI->value).type.cpl < (sexp)(uVar1 + (long)in_R8D))) {
    local_10 = sexp_make_bignum(ctx_00,len_00);
  }
  for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(in_RDX + 0x18 + local_50 * 8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RCX;
    in_stack_ffffffffffffff98._8_8_ = 0;
    in_stack_ffffffffffffff98._0_8_ = local_48;
    in_stack_ffffffffffffff98 = auVar2 * auVar3 + in_stack_ffffffffffffff98;
    *(long *)((long)&local_10->value + (local_50 + (long)in_R8D) * 8 + 0x10) =
         in_stack_ffffffffffffff98._0_8_;
    local_48 = in_stack_ffffffffffffff98._8_8_;
  }
  if (local_48 != 0) {
    if ((local_10->value).type.cpl <= (sexp)(uVar1 + (long)in_R8D)) {
      local_10 = sexp_copy_bignum(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_,
                                  local_10,len_00);
    }
    *(ulong *)((long)&local_10->value + (uVar1 + (long)in_R8D) * 8 + 0x10) = local_48;
  }
  *(sexp_uint_t *)(in_RDI + 0x6080) = len_00;
  return local_10;
}

Assistant:

sexp sexp_bignum_fxmul (sexp ctx, sexp d, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_length(a), *data, *adata=sexp_bignum_data(a),
    carry=0, i;
  sexp_luint_t n;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if ((! d) || (sexp_bignum_length(d) < len+offset))
    d = sexp_make_bignum(ctx, len+offset);
  tmp = d;
  data = sexp_bignum_data(d);
  for (i=0; i<len; i++) {
    n = luint_add(luint_mul_uint(luint_from_uint(adata[i]), b), luint_from_uint(carry));
    data[i+offset] = luint_to_uint(n);
    carry = luint_to_uint(luint_shr(n, (sizeof(sexp_uint_t)*8)));
  }
  if (carry) {
    if (sexp_bignum_length(d) <= len+offset)
      d = sexp_copy_bignum(ctx, NULL, d, len+offset+1);
    sexp_bignum_data(d)[len+offset] = carry;
  }
  sexp_gc_release1(ctx);
  return d;
}